

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

void __thiscall cnn::ComputationGraph::PrintGraphviz(ComputationGraph *this)

{
  bool bVar1;
  reference ppNVar2;
  ostream *poVar3;
  reference pVVar4;
  uint *puVar5;
  VariableIndex arg_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *__range2_1;
  VariableIndex arg;
  iterator __end2;
  iterator __begin2;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_names;
  Node *node;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *__range1;
  uint nc;
  value_type *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  ostream *in_stack_fffffffffffffe80;
  ostream *in_stack_fffffffffffffe98;
  ostream *in_stack_fffffffffffffea0;
  ostream *in_stack_fffffffffffffea8;
  VariableIndex local_11c;
  VariableIndex *local_118;
  __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
  local_110;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *local_108;
  string local_100 [32];
  string local_e0 [55];
  allocator local_a9;
  string local_a8 [32];
  string local_88 [36];
  VariableIndex local_64;
  VariableIndex *local_60;
  __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
  local_58;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *local_50;
  undefined1 local_48 [24];
  Node *local_30;
  Node **local_28;
  __normal_iterator<cnn::Node_*const_*,_std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>_>
  local_20 [2];
  uint local_c;
  
  std::operator<<((ostream *)&std::cerr,"digraph G {\n  rankdir=LR;\n  nodesep=.05;\n");
  local_c = 0;
  local_20[0]._M_current =
       (Node **)std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::begin
                          ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                           in_stack_fffffffffffffe68);
  local_28 = (Node **)std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::end
                                ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                 in_stack_fffffffffffffe68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::Node_*const_*,_std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>_>
                        *)in_stack_fffffffffffffe70,
                       (__normal_iterator<cnn::Node_*const_*,_std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>_>
                        *)in_stack_fffffffffffffe68);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<cnn::Node_*const_*,_std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>_>
              ::operator*(local_20);
    local_30 = *ppNVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x5bf414);
    local_50 = &local_30->args;
    local_58._M_current =
         (VariableIndex *)
         std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::begin
                   ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                    in_stack_fffffffffffffe68);
    local_60 = (VariableIndex *)
               std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::end
                         ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                          in_stack_fffffffffffffe68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                          *)in_stack_fffffffffffffe70,
                         (__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                          *)in_stack_fffffffffffffe68);
      if (!bVar1) break;
      pVVar4 = __gnu_cxx::
               __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
               ::operator*(&local_58);
      VariableIndex::VariableIndex(&local_64,pVVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"v",&local_a9);
      VariableIndex::operator_cast_to_unsigned_int_(&local_64);
      std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffea8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffea0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      __gnu_cxx::
      __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
      ::operator++(&local_58);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"  N");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    poVar3 = std::operator<<(poVar3," [label=\"v");
    in_stack_fffffffffffffea8 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    in_stack_fffffffffffffea0 = std::operator<<(in_stack_fffffffffffffea8," = ");
    (*local_30->_vptr_Node[3])(local_100,local_30,local_48);
    in_stack_fffffffffffffe98 = std::operator<<(in_stack_fffffffffffffea0,local_100);
    std::operator<<(in_stack_fffffffffffffe98,"\"];\n");
    std::__cxx11::string::~string(local_100);
    local_108 = &local_30->args;
    local_110._M_current =
         (VariableIndex *)
         std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::begin
                   ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                    in_stack_fffffffffffffe68);
    local_118 = (VariableIndex *)
                std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::end
                          ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                           in_stack_fffffffffffffe68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                          *)in_stack_fffffffffffffe70,
                         (__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                          *)in_stack_fffffffffffffe68);
      if (!bVar1) break;
      pVVar4 = __gnu_cxx::
               __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
               ::operator*(&local_110);
      VariableIndex::VariableIndex(&local_11c,pVVar4);
      poVar3 = std::operator<<((ostream *)&std::cerr,"  N");
      puVar5 = VariableIndex::operator_cast_to_unsigned_int_(&local_11c);
      in_stack_fffffffffffffe80 = (ostream *)std::ostream::operator<<(poVar3,*puVar5);
      poVar3 = std::operator<<(in_stack_fffffffffffffe80," -> N");
      in_stack_fffffffffffffe70 = (ostream *)std::ostream::operator<<(poVar3,local_c);
      std::operator<<(in_stack_fffffffffffffe70,";\n");
      __gnu_cxx::
      __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
      ::operator++(&local_110);
    }
    local_c = local_c + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe80);
    __gnu_cxx::
    __normal_iterator<cnn::Node_*const_*,_std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>_>::
    operator++(local_20);
  }
  std::operator<<((ostream *)&std::cerr,"}\n");
  return;
}

Assistant:

void ComputationGraph::PrintGraphviz() const {
  cerr << "digraph G {\n  rankdir=LR;\n  nodesep=.05;\n";
  unsigned nc = 0;
  for (auto node : nodes) {
    vector<string> var_names;
    for (auto arg : node->args)
      var_names.push_back(string("v") + to_string((unsigned)arg));
    cerr << "  N" << nc << " [label=\"v" << nc << " = "
         << node->as_string(var_names) << "\"];\n";
    for (auto arg : node->args)
      cerr << "  N" << ((unsigned)arg) << " -> N" << nc << ";\n";
    ++nc;
  }
  cerr << "}\n";
}